

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  GLuint program;
  GLint GVar4;
  ostream *poVar5;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  GLenum e_06;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  Vector<int,_4> *v_01;
  Vector<int,_4> *v_02;
  Vector<int,_4> *v_03;
  Vector<int,_4> *v_04;
  Vector<int,_4> *v_05;
  Vector<int,_4> *v_06;
  Vector<int,_4> *v_07;
  Vector<int,_4> *v_08;
  Vector<int,_4> *v_09;
  Vector<int,_4> *v_10;
  Vector<int,_4> *v_11;
  Vector<int,_4> *v_12;
  Vector<int,_4> *v_13;
  Vector<int,_4> *v_14;
  undefined4 in_register_00000034;
  Vector<int,_4> *vec;
  char *pcVar6;
  long lVar7;
  long lVar8;
  pointer pVVar9;
  int face;
  uint uVar10;
  ulong uVar11;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  string local_6b0;
  string local_690;
  GLuint local_66c;
  GLuint buffer;
  char *local_648 [4];
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  GLuint textures [8];
  Vector<int,_4> local_130;
  Vector<int,_4> local_120;
  Vector<int,_4> local_110;
  Vector<int,_4> local_100;
  Vector<int,_4> local_f0;
  Vector<int,_4> local_e0;
  Vector<int,_4> local_d0;
  Vector<int,_4> local_c0;
  Vector<int,_4> local_b0;
  Vector<int,_4> local_a0;
  Vector<int,_4> local_90;
  Vector<int,_4> local_80;
  Vector<int,_4> local_70;
  Vector<int,_4> local_60;
  Vector<int,_4> local_50;
  Vector<int,_4> local_40;
  
  vec = (Vector<int,_4> *)CONCAT44(in_register_00000034,internalformat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)textures);
  poVar5 = std::operator<<((ostream *)textures,"#version 420 core\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_6b0,(void *)0x8d82,e);
  poVar5 = std::operator<<(poVar5,(string *)&local_6b0);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_690,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_690);
  poVar5 = std::operator<<(poVar5,"image1D g_image_1d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_((string *)&data,(void *)0x8d82,e_00);
  poVar5 = std::operator<<(poVar5,(string *)&data);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>((string *)&buffer,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&buffer);
  poVar5 = std::operator<<(poVar5,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2c8,(void *)0x8d82,e_01);
  poVar5 = std::operator<<(poVar5,(string *)&local_2c8);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_2e8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
  poVar5 = std::operator<<(poVar5,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_308,(void *)0x8d82,e_02);
  poVar5 = std::operator<<(poVar5,(string *)&local_308);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_328,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_328);
  poVar5 = std::operator<<(poVar5,"image2DRect g_image_2drect;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_348,(void *)0x8d82,e_03);
  poVar5 = std::operator<<(poVar5,(string *)&local_348);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_368,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_368);
  poVar5 = std::operator<<(poVar5,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_388,(void *)0x8d82,e_04);
  poVar5 = std::operator<<(poVar5,(string *)&local_388);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_3a8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_3a8);
  poVar5 = std::operator<<(poVar5,"imageBuffer g_image_buffer;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_3c8,(void *)0x8d82,e_05);
  poVar5 = std::operator<<(poVar5,(string *)&local_3c8);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_3e8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_3e8);
  poVar5 = std::operator<<(poVar5,"image1DArray g_image_1darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_408,(void *)0x8d82,e_06);
  poVar5 = std::operator<<(poVar5,(string *)&local_408);
  pcVar6 = ") writeonly uniform ";
  poVar5 = std::operator<<(poVar5,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_428,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_428);
  pcVar6 = 
  "image2DArray g_image_2darray;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_1d, coord.x, "
  ;
  poVar5 = std::operator<<(poVar5,
                           "image2DArray g_image_2darray;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_1d, coord.x, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_448,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_448);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_2d, coord, ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_2d, coord, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_468,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_468);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_3d, ivec3(coord.xy, 0), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_3d, ivec3(coord.xy, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_488,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_488);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_3d, ivec3(coord.xy, 1), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_3d, ivec3(coord.xy, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_4a8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_4a8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_2drect, coord, ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_2drect, coord, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_4c8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_4c8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 0), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_4e8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_4e8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 1), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_508,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_508);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 2), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 2), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_528,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_528);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 3), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 3), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_548,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_548);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 4), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 4), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_568,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_568);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_cube, ivec3(coord, 5), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_cube, ivec3(coord, 5), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_588,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_588);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_buffer, coord.x, ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_buffer, coord.x, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_5a8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_5a8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_1darray, ivec2(coord.x, 0), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_1darray, ivec2(coord.x, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_5c8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_5c8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_1darray, ivec2(coord.x, 1), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_1darray, ivec2(coord.x, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_5e8,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_5e8);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_2darray, ivec3(coord, 0), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_2darray, ivec3(coord, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_608,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_608);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  pcVar6 = ");\n  imageStore(g_image_2darray, ivec3(coord, 1), ";
  poVar5 = std::operator<<(poVar5,");\n  imageStore(g_image_2darray, ivec3(coord, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>(&local_628,pcVar6);
  poVar5 = std::operator<<(poVar5,(string *)&local_628);
  poVar5 = std::operator<<(poVar5,"vec4");
  poVar5 = tcu::operator<<(poVar5,vec);
  std::operator<<(poVar5,");\n  discard;\n}");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)textures);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,local_648[0],(bool *)0x0);
  std::__cxx11::string::~string((string *)local_648);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,8,textures);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&data,0x200,(allocator_type *)&local_6b0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (this_00,0xde0,0,0x8d82,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x806f,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x84f5,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,textures[4]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8516,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8515,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8518,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8517,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x851a,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8519,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8c2a,0x100,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[5]);
  glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d82,buffer);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[6]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0x8c18,0,0x8d82,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[7]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x8c1a,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[1],0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[2],0,'\x01',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[4],0,'\x01',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,5,textures[5],0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,6,textures[6],0,'\x01',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(this_00,7,textures[7],0,'\x01',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,1);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,2);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,3);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,4);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,5);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,6);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,7);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  local_66c = program;
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,textures[0]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde0,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde0,0);
  uVar11 = 0xffffffffffffffff;
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (uVar11 == 0xf) {
      bVar2 = true;
      goto LAB_00a429a6;
    }
    bVar2 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + -0x10;
    lVar7 = lVar7 + 0x10;
  } while (bVar2);
  bVar2 = 0xf < uVar11;
  tcu::Vector<int,_4>::Vector
            (&local_40,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_40,v);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_50,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_50,v_00);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
LAB_00a429a6:
  pVVar9 = data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_6b0,0);
  for (; pVVar9 != data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish; pVVar9 = pVVar9 + 1) {
    *(pointer *)pVVar9->m_data = local_6b0._M_dataplus._M_p;
    *(size_type *)(pVVar9->m_data + 2) = local_6b0._M_string_length;
  }
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x1010) goto LAB_00a42aca;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_60,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_60,v_01);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_70,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_70,v_02);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a42aca:
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,textures[2]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x806f,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x806f,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x2010) goto LAB_00a42bc4;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_80,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_80,v_03);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_90,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_90,v_04);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a42bc4:
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,textures[3]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x84f5,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x84f5,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x1010) goto LAB_00a42cbe;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_a0,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_a0,v_05);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_b0,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_b0,v_06);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a42cbe:
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,textures[4]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
    glu::CallLogWrapper::glGetTexImage
              (this_00,uVar10 + 0x8515,0,0x8d99,0x1404,
               data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    lVar8 = 0x10;
    lVar7 = 0;
    do {
      if (lVar7 + 0x10 == 0x1010) goto LAB_00a42dbf;
      lVar8 = lVar8 + -0x10;
      bVar3 = tcu::allEqual<int,4>
                        ((Vector<int,_4> *)
                         ((long)(data.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                         write_value);
      lVar7 = lVar7 + 0x10;
    } while (bVar3);
    tcu::Vector<int,_4>::Vector
              (&local_c0,
               (Vector<int,_4> *)
               ((long)data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar8));
    ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_c0,v_07);
    _Var1._M_p = local_6b0._M_dataplus._M_p;
    tcu::Vector<int,_4>::Vector(&local_d0,write_value);
    ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_d0,v_08);
    gl4cts::anon_unknown_0::Output
              ("GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n"
               ,(ulong)uVar10,_Var1._M_p,local_690._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    bVar2 = false;
LAB_00a42dbf:
  }
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,textures[5]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,buffer);
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x8c2a,0,0x100,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x110) goto LAB_00a42ef0;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_e0,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_e0,v_09);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_f0,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_f0,v_10);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a42ef0:
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,textures[6]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x8c18,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c18,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x210) goto LAB_00a42fea;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_100,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_100,v_11);
  _Var1._M_p = local_6b0._M_dataplus._M_p;
  tcu::Vector<int,_4>::Vector(&local_110,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_110,v_12);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",_Var1._M_p,
             local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a42fea:
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,textures[7]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x8c1a,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  lVar8 = 0x10;
  lVar7 = 0;
  do {
    if (lVar7 + 0x10 == 0x2010) goto LAB_00a430e4;
    lVar8 = lVar8 + -0x10;
    bVar3 = tcu::allEqual<int,4>
                      ((Vector<int,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7),
                       write_value);
    lVar7 = lVar7 + 0x10;
  } while (bVar3);
  tcu::Vector<int,_4>::Vector
            (&local_120,
             (Vector<int,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start - lVar8));
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_6b0,&local_120,v_13);
  tcu::Vector<int,_4>::Vector(&local_130,write_value);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_690,&local_130,v_14);
  gl4cts::anon_unknown_0::Output
            ("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
             local_6b0._M_dataplus._M_p,local_690._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = false;
LAB_00a430e4:
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,local_66c);
  glu::CallLogWrapper::glDeleteTextures(this_00,8,textures);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  return bVar2;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		GLuint		 textures[8];
		GLuint		 buffer;
		glGenTextures(8, textures);
		glGenBuffers(1, &buffer);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 2);

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, internalformat, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glBufferData(GL_TEXTURE_BUFFER, kSize * sizeof(T), &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glTexBuffer(GL_TEXTURE_BUFFER, internalformat, buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, internalformat, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image_buffer"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image_1darray"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image_2darray"), 7);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}
		std::fill(data.begin(), data.end(), T(0));

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_3D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_RECTANGLE, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		{
			glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			for (int face = 0; face < 6; ++face)
			{
				glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
				for (int i = 0; i < kSize * kSize; ++i)
				{
					if (!tcu::allEqual(data[i], expected_value))
					{
						status = false;
						Output(
							"GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n",
							face, ToString(data[i]).c_str(), ToString(expected_value).c_str());
						break;
					}
				}
			}
			glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
		}

		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glBindTexture(GL_TEXTURE_BUFFER, 0);
		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, kSize * sizeof(T), &data[0]);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);
		for (int i = 0; i < kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(8, textures);
		glDeleteBuffers(1, &buffer);

		return status;
	}